

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O2

Matrix2f __thiscall Matrix2f::inverse(Matrix2f *this,bool *pbIsSingular,float epsilon)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 *in_RDX;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Matrix2f MVar8;
  
  fVar1 = *(float *)pbIsSingular;
  fVar2 = *(float *)(pbIsSingular + 4);
  fVar5 = *(float *)(pbIsSingular + 0xc);
  fVar6 = 0.0;
  fVar3 = *(float *)(pbIsSingular + 8);
  fVar7 = fVar1 * fVar5 - fVar2 * fVar3;
  if (epsilon <= ABS(fVar7)) {
    if (in_RDX != (undefined1 *)0x0) {
      *in_RDX = 0;
    }
    fVar7 = 1.0 / fVar7;
    uVar4 = CONCAT44(fVar7,fVar7);
    fVar5 = fVar5 * fVar7;
    fVar6 = -fVar2 * fVar7;
    this->m_elements[0] = fVar5;
    this->m_elements[1] = fVar6;
    this->m_elements[2] = -fVar3 * fVar7;
    this->m_elements[3] = fVar1 * fVar7;
  }
  else {
    if (in_RDX != (undefined1 *)0x0) {
      *in_RDX = 1;
    }
    Matrix2f(this,0.0);
    uVar4 = extraout_XMM0_Qa;
  }
  MVar8.m_elements[3] = fVar6;
  MVar8.m_elements[2] = fVar5;
  MVar8.m_elements[0] = (float)(int)uVar4;
  MVar8.m_elements[1] = (float)(int)((ulong)uVar4 >> 0x20);
  return (Matrix2f)MVar8.m_elements;
}

Assistant:

Matrix2f Matrix2f::inverse( bool* pbIsSingular, float epsilon )
{
	float determinant = m_elements[ 0 ] * m_elements[ 3 ] - m_elements[ 2 ] * m_elements[ 1 ];

	bool isSingular = ( fabs( determinant ) < epsilon );
	if( isSingular )
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = true;
		}
		return Matrix2f();
	}
	else
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = false;
		}

		float reciprocalDeterminant = 1.0f / determinant;

		return Matrix2f
		(
			m_elements[ 3 ] * reciprocalDeterminant, -m_elements[ 2 ] * reciprocalDeterminant,
			-m_elements[ 1 ] * reciprocalDeterminant, m_elements[ 0 ] * reciprocalDeterminant
		);
	}
}